

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

void __thiscall
cmake::GetRegisteredGenerators
          (cmake *this,
          vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> *generators)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  _Base_ptr p_Var3;
  ulong uVar4;
  pointer ppcVar5;
  _Rb_tree_header *p_Var6;
  GeneratorInfo info;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  value_type local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  cmake *local_40;
  pointer local_38;
  
  ppcVar5 = (this->Generators).
            super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (this->Generators).
             super__Vector_base<cmGlobalGeneratorFactory_*,_std::allocator<cmGlobalGeneratorFactory_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_40 = this;
  if (ppcVar5 != local_38) {
    paVar1 = &local_80.name.field_2;
    do {
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (*(*ppcVar5)->_vptr_cmGlobalGeneratorFactory[4])(*ppcVar5,&local_58);
      if (local_58.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_58.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar4 = 0;
        do {
          local_80.name._M_string_length = 0;
          local_80.name.field_2._M_local_buf[0] = '\0';
          local_80.name._M_dataplus._M_p = (pointer)paVar1;
          iVar2 = (*(*ppcVar5)->_vptr_cmGlobalGeneratorFactory[5])();
          local_80.supportsToolset = SUB41(iVar2,0);
          std::__cxx11::string::_M_assign((string *)&local_80);
          std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::push_back
                    (generators,&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80.name._M_dataplus._M_p != paVar1) {
            operator_delete(local_80.name._M_dataplus._M_p,
                            CONCAT71(local_80.name.field_2._M_allocated_capacity._1_7_,
                                     local_80.name.field_2._M_local_buf[0]) + 1);
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 < (ulong)((long)local_58.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_58.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_58);
      ppcVar5 = ppcVar5 + 1;
    } while (ppcVar5 != local_38);
  }
  p_Var3 = (local_40->ExtraGenerators)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var6 = &(local_40->ExtraGenerators)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var6) {
    paVar1 = &local_80.name.field_2;
    do {
      local_80.name._M_string_length = 0;
      local_80.name.field_2._M_local_buf[0] = '\0';
      local_80.name._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_assign((string *)&local_80);
      local_80.supportsToolset = false;
      std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::push_back
                (generators,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.name._M_dataplus._M_p != paVar1) {
        operator_delete(local_80.name._M_dataplus._M_p,
                        CONCAT71(local_80.name.field_2._M_allocated_capacity._1_7_,
                                 local_80.name.field_2._M_local_buf[0]) + 1);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var6);
  }
  return;
}

Assistant:

void cmake::GetRegisteredGenerators(std::vector<GeneratorInfo>& generators)
{
  for (RegisteredGeneratorsVector::const_iterator
       i = this->Generators.begin(), e = this->Generators.end();
       i != e; ++i)
    {
    std::vector<std::string> names;
    (*i)->GetGenerators(names);

    for (size_t j = 0; j < names.size(); ++j)
      {
      GeneratorInfo info;
      info.supportsToolset = (*i)->SupportsToolset();
      info.name = names[j];
      generators.push_back(info);
      }
    }

  for (RegisteredExtraGeneratorsMap::const_iterator
       i = this->ExtraGenerators.begin(), e = this->ExtraGenerators.end();
       i != e; ++i)
    {
    GeneratorInfo info;
    info.name = i->first;
    info.supportsToolset = false;
    generators.push_back(info);
    }
}